

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int str_utf8_encode(char *ptr,int chr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int chr_local;
  char *ptr_local;
  int local_4;
  
  bVar3 = (byte)chr;
  if (chr < 0x80) {
    *ptr = bVar3;
    local_4 = 1;
  }
  else {
    bVar1 = (byte)(chr >> 6);
    if (chr < 0x800) {
      *ptr = bVar1 & 0x1f | 0xc0;
      ptr[1] = bVar3 & 0x3f | 0x80;
      local_4 = 2;
    }
    else {
      bVar2 = (byte)(chr >> 0xc);
      if (chr < 0x10000) {
        *ptr = bVar2 & 0xf | 0xe0;
        ptr[1] = bVar1 & 0x3f | 0x80;
        ptr[2] = bVar3 & 0x3f | 0x80;
        local_4 = 3;
      }
      else if (chr < 0x110000) {
        *ptr = (byte)(chr >> 0x12) & 7 | 0xf0;
        ptr[1] = bVar2 & 0x3f | 0x80;
        ptr[2] = bVar1 & 0x3f | 0x80;
        ptr[3] = bVar3 & 0x3f | 0x80;
        local_4 = 4;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int str_utf8_encode(char *ptr, int chr)
{
	/* encode */
	if(chr <= 0x7F)
	{
		ptr[0] = (char)chr;
		return 1;
	}
	else if(chr <= 0x7FF)
	{
		ptr[0] = 0xC0|((chr>>6)&0x1F);
		ptr[1] = 0x80|(chr&0x3F);
		return 2;
	}
	else if(chr <= 0xFFFF)
	{
		ptr[0] = 0xE0|((chr>>12)&0x0F);
		ptr[1] = 0x80|((chr>>6)&0x3F);
		ptr[2] = 0x80|(chr&0x3F);
		return 3;
	}
	else if(chr <= 0x10FFFF)
	{
		ptr[0] = 0xF0|((chr>>18)&0x07);
		ptr[1] = 0x80|((chr>>12)&0x3F);
		ptr[2] = 0x80|((chr>>6)&0x3F);
		ptr[3] = 0x80|(chr&0x3F);
		return 4;
	}

	return 0;
}